

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# week3-app1.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  ostream *poVar1;
  
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x1e);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,600);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0xf);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x32);
  std::endl<char,std::char_traits<char>>(poVar1);
  return 0;
}

Assistant:

int main(int argc, char* argv[])
{
//    int(*func)(int, int);
    Func func;
    func = &add;

    int addition = run(10, 5, &add);

    int r1 = add(10, 20);
    int r2 = add(100, 200, 300);
    std::cout << r1 << std::endl;
    std::cout << r2 << std::endl;

//    int addition = add(10, 5);

    int product = run(10, 5, &multiply);
    std::cout << addition << std::endl;
    std::cout << product << std::endl;
    return 0;
}